

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleFilterCols_C(uint8_t *dst_ptr,uint8_t *src_ptr,int dst_width,int x,int dx)

{
  long lVar1;
  uint uVar2;
  
  if (1 < dst_width) {
    lVar1 = 0;
    do {
      dst_ptr[lVar1] =
           (char)(((uint)src_ptr[(long)(x >> 0x10) + 1] - (uint)src_ptr[x >> 0x10]) *
                  ((uint)x >> 9 & 0x7f) + 0x40 >> 7) + src_ptr[x >> 0x10];
      uVar2 = x + dx;
      dst_ptr[lVar1 + 1] =
           (char)(((uint)src_ptr[(long)((int)uVar2 >> 0x10) + 1] - (uint)src_ptr[(int)uVar2 >> 0x10]
                  ) * (uVar2 >> 9 & 0x7f) + 0x40 >> 7) + src_ptr[(int)uVar2 >> 0x10];
      x = uVar2 + dx;
      lVar1 = lVar1 + 2;
    } while ((int)lVar1 < dst_width + -1);
    dst_ptr = dst_ptr + lVar1;
  }
  if ((dst_width & 1U) != 0) {
    *dst_ptr = (char)(((uint)src_ptr[(long)(x >> 0x10) + 1] - (uint)src_ptr[x >> 0x10]) *
                      ((uint)x >> 9 & 0x7f) + 0x40 >> 7) + src_ptr[x >> 0x10];
  }
  return;
}

Assistant:

void ScaleFilterCols_C(uint8_t* dst_ptr,
                       const uint8_t* src_ptr,
                       int dst_width,
                       int x,
                       int dx) {
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
    x += dx;
    xi = x >> 16;
    a = src_ptr[xi];
    b = src_ptr[xi + 1];
    dst_ptr[1] = BLENDER(a, b, x & 0xffff);
    x += dx;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    int xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
  }
}